

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr **ppPVar1;
  uint uVar2;
  PgHdr *pPVar3;
  PgHdr *pPVar4;
  PgHdr *pPVar5;
  PgHdr *pPVar6;
  long lVar7;
  PgHdr *pPVar8;
  PgHdr *pPVar9;
  bool bVar10;
  PgHdr result;
  PgHdr local_150;
  PgHdr *local_108 [32];
  
  pPVar5 = pCache->pDirty;
  while (pPVar5 != (PgHdr *)0x0) {
    pPVar5->pDirty = pPVar5->pDirtyNext;
    pPVar5 = pPVar5->pDirtyNext;
  }
  pPVar5 = pCache->pDirty;
  memset(local_108,0,0x100);
  if (pPVar5 != (PgHdr *)0x0) {
    do {
      pPVar3 = pPVar5->pDirty;
      pPVar5->pDirty = (PgHdr *)0x0;
      lVar7 = 0;
      do {
        pPVar8 = &local_150;
        pPVar9 = local_108[lVar7];
        if (local_108[lVar7] == (PgHdr *)0x0) {
          local_108[lVar7] = pPVar5;
          bVar10 = lVar7 == 0x1f;
          goto LAB_00204a72;
        }
        do {
          pPVar6 = pPVar9;
          uVar2 = pPVar6->pgno;
          while (pPVar5->pgno <= uVar2) {
            pPVar8->pDirty = pPVar5;
            ppPVar1 = &pPVar5->pDirty;
            pPVar4 = pPVar6;
            pPVar8 = pPVar5;
            pPVar5 = *ppPVar1;
            if (*ppPVar1 == (PgHdr *)0x0) goto LAB_00204a47;
          }
          pPVar8->pDirty = pPVar6;
          pPVar4 = pPVar5;
          pPVar8 = pPVar6;
          pPVar9 = pPVar6->pDirty;
        } while (pPVar6->pDirty != (PgHdr *)0x0);
LAB_00204a47:
        pPVar8->pDirty = pPVar4;
        local_108[lVar7] = (PgHdr *)0x0;
        lVar7 = lVar7 + 1;
        pPVar5 = local_150.pDirty;
      } while (lVar7 != 0x1f);
      bVar10 = true;
LAB_00204a72:
      pPVar8 = &local_150;
      pPVar9 = local_108[0x1f];
      if (bVar10) {
        do {
          uVar2 = pPVar9->pgno;
          while (pPVar5->pgno <= uVar2) {
            pPVar8->pDirty = pPVar5;
            ppPVar1 = &pPVar5->pDirty;
            pPVar6 = pPVar9;
            pPVar8 = pPVar5;
            pPVar5 = *ppPVar1;
            if (*ppPVar1 == (PgHdr *)0x0) goto LAB_00204ac0;
          }
          pPVar8->pDirty = pPVar9;
          ppPVar1 = &pPVar9->pDirty;
          pPVar6 = pPVar5;
          pPVar8 = pPVar9;
          pPVar9 = *ppPVar1;
        } while (*ppPVar1 != (PgHdr *)0x0);
LAB_00204ac0:
        pPVar8->pDirty = pPVar6;
        local_108[0x1f] = local_150.pDirty;
      }
      pPVar5 = pPVar3;
    } while (pPVar3 != (PgHdr *)0x0);
  }
  lVar7 = 1;
  do {
    pPVar5 = local_108[lVar7];
    pPVar3 = local_108[0];
    if ((pPVar5 != (PgHdr *)0x0) &&
       (pPVar3 = pPVar5, pPVar8 = &local_150, local_108[0] != (PgHdr *)0x0)) {
      do {
        pPVar3 = local_108[0];
        uVar2 = pPVar3->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar8->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar9 = pPVar3;
          pPVar8 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_00204b3a;
        }
        pPVar8->pDirty = pPVar3;
        local_108[0] = pPVar3->pDirty;
        pPVar9 = pPVar5;
        pPVar8 = pPVar3;
      } while (pPVar3->pDirty != (PgHdr *)0x0);
LAB_00204b3a:
      pPVar8->pDirty = pPVar9;
      pPVar3 = local_150.pDirty;
    }
    lVar7 = lVar7 + 1;
    local_108[0] = pPVar3;
    if (lVar7 == 0x20) {
      return pPVar3;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}